

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<tcu::Matrix<float,_2,_2>_> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Inverse<2>::doExpand
          (Inverse<2> *this,ExpandContext *ctx,ArgExprs *args)

{
  ExprP<tcu::Matrix<float,_2,_2>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<tcu::Matrix<float,_2,_2>_> EVar1;
  ExprP<tcu::Vector<float,_2>_> local_1b0;
  ExprP<float> local_1a0;
  ExprP<float> local_190;
  ExprP<tcu::Vector<float,_2>_> local_180;
  ExprP<float> local_170;
  ExprP<float> local_160;
  ExprP<float> local_150;
  ExprP<tcu::Vector<float,_2>_> local_140;
  ExprP<tcu::Vector<float,_2>_> local_130;
  ExprP<float> local_120;
  ExprP<float> local_110;
  ExprP<float> local_100;
  ExprP<tcu::Vector<float,_2>_> local_f0;
  ExprP<float> local_e0;
  ExprP<float> local_d0;
  ExprP<tcu::Vector<float,_2>_> local_c0;
  ExprP<tcu::Matrix<float,_2,_2>_> local_b0;
  ExprP<float> local_a0 [2];
  allocator<char> local_79;
  string local_78;
  VariableP<float> local_58;
  undefined1 local_48 [8];
  ExprP<float> det;
  ExprP<tcu::Matrix<float,_2,_2>_> mat;
  ArgExprs *args_local;
  ExpandContext *ctx_local;
  Inverse<2> *this_local;
  
  ExprP<tcu::Matrix<float,_2,_2>_>::ExprP
            ((ExprP<tcu::Matrix<float,_2,_2>_> *)
             &det.super_ExprPBase<float>.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state,in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"det",&local_79);
  ExprP<tcu::Matrix<float,_2,_2>_>::ExprP
            (&local_b0,
             (ExprP<tcu::Matrix<float,_2,_2>_> *)
             &det.super_ExprPBase<float>.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  determinant<2>((Functions *)local_a0,&local_b0);
  bindExpression<float>((BuiltinPrecisionTests *)&local_58,&local_78,(ExpandContext *)args,local_a0)
  ;
  BuiltinPrecisionTests::VariableP::operator_cast_to_ExprP((VariableP *)local_48);
  VariableP<float>::~VariableP(&local_58);
  ExprP<float>::~ExprP(local_a0);
  ExprP<tcu::Matrix<float,_2,_2>_>::~ExprP(&local_b0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_f0,(int)&det + 8);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_e0,(int)&local_f0);
  BuiltinPrecisionTests::operator/
            ((BuiltinPrecisionTests *)&local_d0,&local_e0,(ExprP<float> *)local_48);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_130,(int)&det + 8);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_120,(int)&local_130);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_110,&local_120);
  BuiltinPrecisionTests::operator/
            ((BuiltinPrecisionTests *)&local_100,&local_110,(ExprP<float> *)local_48);
  vec2((Functions *)&local_c0,&local_d0,&local_100);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_180,(int)&det + 8);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_170,(int)&local_180);
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_160,&local_170);
  BuiltinPrecisionTests::operator/
            ((BuiltinPrecisionTests *)&local_150,&local_160,(ExprP<float> *)local_48);
  ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *)&local_1b0,(int)&det + 8);
  ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
            ((ContainerExprPBase<tcu::Vector<float,_2>_> *)&local_1a0,(int)&local_1b0);
  BuiltinPrecisionTests::operator/
            ((BuiltinPrecisionTests *)&local_190,&local_1a0,(ExprP<float> *)local_48);
  vec2((Functions *)&local_140,&local_150,&local_190);
  mat2<float,2>((Functions *)this,&local_c0,&local_140);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_140);
  ExprP<float>::~ExprP(&local_190);
  ExprP<float>::~ExprP(&local_1a0);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_1b0);
  ExprP<float>::~ExprP(&local_150);
  ExprP<float>::~ExprP(&local_160);
  ExprP<float>::~ExprP(&local_170);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_180);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_c0);
  ExprP<float>::~ExprP(&local_100);
  ExprP<float>::~ExprP(&local_110);
  ExprP<float>::~ExprP(&local_120);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_130);
  ExprP<float>::~ExprP(&local_d0);
  ExprP<float>::~ExprP(&local_e0);
  ExprP<tcu::Vector<float,_2>_>::~ExprP(&local_f0);
  ExprP<float>::~ExprP((ExprP<float> *)local_48);
  ExprP<tcu::Matrix<float,_2,_2>_>::~ExprP
            ((ExprP<tcu::Matrix<float,_2,_2>_> *)
             &det.super_ExprPBase<float>.
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state);
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state
       = extraout_RDX;
  EVar1.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_2,_2>_> *)this;
  return (ExprP<tcu::Matrix<float,_2,_2>_>)
         EVar1.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>;
}

Assistant:

ExprP<Ret>	doExpand (ExpandContext& ctx, const ArgExprs& args) const
	{
		ExprP<Mat2>		mat = args.a;
		ExprP<float>	det	= bindExpression("det", ctx, determinant(mat));

		return mat2(vec2(mat[1][1] / det, -mat[0][1] / det),
					vec2(-mat[1][0] / det, mat[0][0] / det));
	}